

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

void __thiscall
libtorrent::torrent_alert::torrent_alert
          (torrent_alert *this,stack_allocator *alloc,torrent_handle *h)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  allocation_slot aVar3;
  rep rVar4;
  undefined *in_RCX;
  string_view str;
  string_view str_00;
  string_view str_01;
  span<const_char> in;
  span<const_char> in_00;
  shared_ptr<libtorrent::aux::torrent> t;
  string name_str;
  string local_68;
  torrent_handle local_48;
  string local_38;
  
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_004ebb50;
  rVar4 = ::std::chrono::_V2::system_clock::now();
  (this->super_alert).m_timestamp.__d.__r = rVar4;
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__torrent_alert_004ebb90;
  (this->handle).m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (h->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var1 = (h->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->handle).m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RCX = &__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    }
  }
  (this->m_alloc)._M_data = alloc;
  (this->m_name_idx).m_idx = -1;
  torrent_handle::native_handle(&local_48);
  if (local_48.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (torrent *)0x0) {
    aVar3 = aux::stack_allocator::copy_string(alloc,"");
    (this->m_name_idx).m_idx = aVar3.m_idx;
  }
  else {
    aux::torrent::name_abi_cxx11_
              (&local_38,
               local_48.m_torrent.
               super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (local_38._M_string_length == 0) {
      bVar2 = digest32<256L>::is_all_zeros
                        (&((local_48.m_torrent.
                            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_info_hash).v2);
      if (bVar2) {
        in.m_len = (difference_type)in_RCX;
        in.m_ptr = (char *)0x14;
        aux::to_hex_abi_cxx11_
                  (&local_68,
                   (aux *)&(local_48.m_torrent.
                            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_info_hash,in);
        str_00._M_str = local_68._M_dataplus._M_p;
        str_00._M_len = local_68._M_string_length;
        aVar3 = aux::stack_allocator::copy_string(alloc,str_00);
      }
      else {
        in_00.m_len = (difference_type)in_RCX;
        in_00.m_ptr = &DAT_00000020;
        aux::to_hex_abi_cxx11_
                  (&local_68,
                   (aux *)&((local_48.m_torrent.
                             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_info_hash).v2,in_00);
        str_01._M_str = local_68._M_dataplus._M_p;
        str_01._M_len = local_68._M_string_length;
        aVar3 = aux::stack_allocator::copy_string(alloc,str_01);
      }
      (this->m_name_idx).m_idx = aVar3.m_idx;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      str._M_str = local_38._M_dataplus._M_p;
      str._M_len = local_38._M_string_length;
      aVar3 = aux::stack_allocator::copy_string(alloc,str);
      (this->m_name_idx).m_idx = aVar3.m_idx;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_48.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.m_torrent.
               super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

torrent_alert::torrent_alert(aux::stack_allocator& alloc
		, torrent_handle const& h)
		: handle(h)
		, m_alloc(alloc)
	{
		auto t = h.native_handle();
		if (t)
		{
			std::string name_str = t->name();
			if (!name_str.empty())
			{
				m_name_idx = alloc.copy_string(name_str);
			}
			else
			{
				if (t->info_hash().has_v2())
					m_name_idx = alloc.copy_string(aux::to_hex(t->info_hash().v2));
				else
					m_name_idx = alloc.copy_string(aux::to_hex(t->info_hash().v1));
			}
		}
		else
		{
			m_name_idx = alloc.copy_string("");
		}

#if TORRENT_ABI_VERSION == 1
		name = m_alloc.get().ptr(m_name_idx);
#endif
	}